

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTexture.cpp
# Opt level: O0

bool __thiscall
GmmLib::GmmTextureCalc::GmmGetD3DToHwTileConversion
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t *pColFactor,uint32_t *pRowFactor
          )

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t H;
  uint32_t W;
  uint32_t Bpp;
  uint32_t i;
  uint32_t *pRowFactor_local;
  uint32_t *pColFactor_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmTextureCalc *this_local;
  
  uVar3 = pTexInfo->BitsPerPixel;
  if ((((uVar3 == 8) || (uVar3 == 0x10)) || (uVar3 == 0x20)) || ((uVar3 == 0x40 || (uVar3 == 0x80)))
     ) {
    if ((((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0) &&
       ((((ulong)(pTexInfo->Flags).Info >> 0x2c & 1) == 0 &&
        (((ulong)(pTexInfo->Flags).Info >> 0x13 & 1) == 0)))) {
      if ((((ulong)(pTexInfo->Flags).Info >> 0x24 & 1) == 0) &&
         (((ulong)(pTexInfo->Flags).Info >> 0x2b & 1) == 0)) goto LAB_0028d8d1;
      uVar3 = __GmmLog2(uVar3);
      *pColFactor = __GmmTileYConversionTable[uVar3 - 3][0];
      *pRowFactor = __GmmTileYConversionTable[uVar3 - 3][1];
      if (1 < (pTexInfo->MSAA).NumSamples) {
        uVar3 = __GmmLog2((pTexInfo->MSAA).NumSamples);
        uVar1 = __GmmMSAAConversion[uVar3][0];
        uVar3 = __GmmLog2((pTexInfo->MSAA).NumSamples);
        uVar2 = __GmmMSAAConversion[uVar3][1];
        *pColFactor = *pColFactor / uVar1;
        *pRowFactor = *pRowFactor / uVar2;
      }
    }
    else {
      *pColFactor = 1;
      *pRowFactor = 1;
    }
    this_local._7_1_ = true;
  }
  else {
LAB_0028d8d1:
    *pColFactor = 0;
    *pRowFactor = 0;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool GmmLib::GmmTextureCalc::GmmGetD3DToHwTileConversion(GMM_TEXTURE_INFO *pTexInfo,
                                                         uint32_t *        pColFactor,
                                                         uint32_t *        pRowFactor)
{
    uint32_t i   = 0;
    uint32_t Bpp = pTexInfo->BitsPerPixel;

    // check for  unsupported bpp
    if(!(Bpp == 8 || Bpp == 16 || Bpp == 32 || Bpp == 64 || Bpp == 128))
    {
        __GMM_ASSERT(false);
        goto EXIT_ERROR;
    }

    // for TileYS, no conversion
    if(GMM_IS_64KB_TILE(pTexInfo->Flags) || pTexInfo->Flags.Info.Linear)
    {
        *pColFactor = 1;
        *pRowFactor = 1;
    }
    else if(GMM_IS_4KB_TILE(pTexInfo->Flags))
    {
        // Logic for non-MSAA
        {
            //      Bpp = 8      => i = 0           , Bpp = 16 => i = 1, ...
            // Log2(Bpp = 8) = 3 => i = Log2(8) - 3.

            i           = __GmmLog2(Bpp) - 3;
            *pColFactor = __GmmTileYConversionTable[i][0];
            *pRowFactor = __GmmTileYConversionTable[i][1];
        }

        // Logic for MSAA
        if(pTexInfo->MSAA.NumSamples > 1)
        {

            // For MSAA, the DirectX tile dimensions change, using the table __GmmMSAAConversion.
            uint32_t W = __GmmMSAAConversion[__GmmLog2(pTexInfo->MSAA.NumSamples)][0];
            uint32_t H = __GmmMSAAConversion[__GmmLog2(pTexInfo->MSAA.NumSamples)][1];

            // For the new DirectX tile dimensions the new Col and Row conversion factors are:
            *pColFactor /= W;
            *pRowFactor /= H;
        }
    }
    else
    {
        // unsupported format.
        __GMM_ASSERT(false);
        goto EXIT_ERROR;
    }

    return true;

EXIT_ERROR:
    *pColFactor = 0;
    *pRowFactor = 0;
    return false;
}